

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O1

XmlWriter * __thiscall Catch::XmlWriter::endElement(XmlWriter *this,XmlFormatting fmt)

{
  pointer pbVar1;
  pointer pcVar2;
  ostream *poVar3;
  long *local_40 [2];
  long local_30 [2];
  
  std::__cxx11::string::substr((ulong)local_40,(ulong)&this->m_indent);
  std::__cxx11::string::operator=((string *)&this->m_indent,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if (this->m_tagIsOpen == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->m_os,"/>",2);
    this->m_tagIsOpen = false;
  }
  else {
    newlineIfNecessary(this);
    if ((fmt & Indent) != None) {
      std::__ostream_insert<char,std::char_traits<char>>
                (this->m_os,(this->m_indent)._M_dataplus._M_p,(this->m_indent)._M_string_length);
    }
    poVar3 = this->m_os;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</",2);
    pbVar1 = (this->m_tags).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,pbVar1[-1]._M_dataplus._M_p,pbVar1[-1]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
  }
  std::ostream::flush();
  this->m_needsNewline = (bool)((byte)fmt >> 1 & 1);
  pbVar1 = (this->m_tags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
  pcVar2 = pbVar1[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &pbVar1[-1].field_2) {
    operator_delete(pcVar2,pbVar1[-1].field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::endElement(XmlFormatting fmt) {
        m_indent = m_indent.substr(0, m_indent.size() - 2);

        if( m_tagIsOpen ) {
            m_os << "/>";
            m_tagIsOpen = false;
        } else {
            newlineIfNecessary();
            if (shouldIndent(fmt)) {
                m_os << m_indent;
            }
            m_os << "</" << m_tags.back() << ">";
        }
        m_os << std::flush;
        applyFormatting(fmt);
        m_tags.pop_back();
        return *this;
    }